

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

Var Js::RegexHelper::NonMatchValue(ScriptContext *scriptContext,bool isGlobalCtor)

{
  JavascriptLibrary *pJVar1;
  bool isGlobalCtor_local;
  ScriptContext *scriptContext_local;
  
  if (isGlobalCtor) {
    pJVar1 = ScriptContext::GetLibrary(scriptContext);
    scriptContext_local = (ScriptContext *)JavascriptLibrary::GetEmptyString(pJVar1);
  }
  else {
    pJVar1 = ScriptContext::GetLibrary(scriptContext);
    scriptContext_local =
         (ScriptContext *)JavascriptLibraryBase::GetUndefined(&pJVar1->super_JavascriptLibraryBase);
  }
  return scriptContext_local;
}

Assistant:

Var RegexHelper::NonMatchValue(ScriptContext* scriptContext, bool isGlobalCtor)
    {
        // SPEC DEVIATION: The $n properties of the RegExp ctor use empty strings rather than undefined to represent
        //                 the non-match value, even in ES5 mode.
        if (isGlobalCtor)
            return scriptContext->GetLibrary()->GetEmptyString();
        else
            return scriptContext->GetLibrary()->GetUndefined();
    }